

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O0

longlong NULLCFile::FileTell(File *file)

{
  File *file_local;
  
  if (file == (File *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    file_local = (File *)0x0;
  }
  else if (file->handle == (FILE *)0x0) {
    nullcThrowError("Cannot tell cursor position in a closed file.");
    file_local = (File *)0x0;
  }
  else {
    file_local = (File *)ftell((FILE *)file->handle);
  }
  return (longlong)file_local;
}

Assistant:

long long FileTell(File* file)
	{
		if(!file)
		{
			nullcThrowError("ERROR: null pointer access");
			return 0;
		}

		if(!file->handle)
		{
			nullcThrowError("Cannot tell cursor position in a closed file.");
			return 0;
		}

		return ftell(file->handle);
	}